

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O1

void __thiscall
duckdb::BuiltinFunctions::AddFunction
          (BuiltinFunctions *this,string *name,PragmaFunctionSet *functions)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  CreatePragmaFunctionInfo info;
  string local_230;
  PragmaFunctionSet local_210;
  CreatePragmaFunctionInfo local_1d8;
  
  pcVar3 = (name->_M_dataplus)._M_p;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,pcVar3,pcVar3 + name->_M_string_length);
  paVar2 = &local_210.super_FunctionSet<duckdb::PragmaFunction>.name.field_2;
  local_210.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p =
       (functions->super_FunctionSet<duckdb::PragmaFunction>).name._M_dataplus._M_p;
  paVar1 = &(functions->super_FunctionSet<duckdb::PragmaFunction>).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p == paVar1) {
    local_210.super_FunctionSet<duckdb::PragmaFunction>.name.field_2._M_allocated_capacity =
         paVar1->_M_allocated_capacity;
    local_210.super_FunctionSet<duckdb::PragmaFunction>.name.field_2._8_8_ =
         *(undefined8 *)
          ((long)&(functions->super_FunctionSet<duckdb::PragmaFunction>).name.field_2 + 8);
    local_210.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_210.super_FunctionSet<duckdb::PragmaFunction>.name.field_2._M_allocated_capacity =
         paVar1->_M_allocated_capacity;
  }
  local_210.super_FunctionSet<duckdb::PragmaFunction>.name._M_string_length =
       (functions->super_FunctionSet<duckdb::PragmaFunction>).name._M_string_length;
  (functions->super_FunctionSet<duckdb::PragmaFunction>).name._M_dataplus._M_p = (pointer)paVar1;
  (functions->super_FunctionSet<duckdb::PragmaFunction>).name._M_string_length = 0;
  (functions->super_FunctionSet<duckdb::PragmaFunction>).name.field_2._M_local_buf[0] = '\0';
  local_210.super_FunctionSet<duckdb::PragmaFunction>.functions.
  super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
  super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
  super__Vector_impl_data._M_start =
       (functions->super_FunctionSet<duckdb::PragmaFunction>).functions.
       super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
       super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_210.super_FunctionSet<duckdb::PragmaFunction>.functions.
  super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
  super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (functions->super_FunctionSet<duckdb::PragmaFunction>).functions.
       super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
       super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_210.super_FunctionSet<duckdb::PragmaFunction>.functions.
  super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
  super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (functions->super_FunctionSet<duckdb::PragmaFunction>).functions.
       super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
       super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (functions->super_FunctionSet<duckdb::PragmaFunction>).functions.
  super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
  super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (functions->super_FunctionSet<duckdb::PragmaFunction>).functions.
  super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
  super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (functions->super_FunctionSet<duckdb::PragmaFunction>).functions.
  super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
  super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  CreatePragmaFunctionInfo::CreatePragmaFunctionInfo(&local_1d8,&local_230,&local_210);
  ::std::vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>::~vector
            (&local_210.super_FunctionSet<duckdb::PragmaFunction>.functions.
              super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_210.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  local_1d8.super_CreateFunctionInfo.super_CreateInfo.internal = true;
  Catalog::CreatePragmaFunction(this->catalog,this->transaction,&local_1d8);
  local_1d8.super_CreateFunctionInfo.super_CreateInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreatePragmaFunctionInfo_019b1050;
  ::std::vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>::~vector
            (&local_1d8.functions.super_FunctionSet<duckdb::PragmaFunction>.functions.
              super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.functions.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p !=
      &local_1d8.functions.super_FunctionSet<duckdb::PragmaFunction>.name.field_2) {
    operator_delete(local_1d8.functions.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus.
                    _M_p);
  }
  local_1d8.super_CreateFunctionInfo.super_CreateInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateFunctionInfo_01996630;
  ::std::vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>::~vector
            (&local_1d8.super_CreateFunctionInfo.descriptions.
              super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.super_CreateFunctionInfo.alias_of._M_dataplus._M_p !=
      &local_1d8.super_CreateFunctionInfo.alias_of.field_2) {
    operator_delete(local_1d8.super_CreateFunctionInfo.alias_of._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.super_CreateFunctionInfo.name._M_dataplus._M_p !=
      &local_1d8.super_CreateFunctionInfo.name.field_2) {
    operator_delete(local_1d8.super_CreateFunctionInfo.name._M_dataplus._M_p);
  }
  CreateInfo::~CreateInfo((CreateInfo *)&local_1d8);
  return;
}

Assistant:

void BuiltinFunctions::AddFunction(const string &name, PragmaFunctionSet functions) {
	CreatePragmaFunctionInfo info(name, std::move(functions));
	info.internal = true;
	catalog.CreatePragmaFunction(transaction, info);
}